

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O0

void __thiscall Pl_Buffer::getMallocBuffer(Pl_Buffer *this,uchar **buf,size_t *len)

{
  pointer pMVar1;
  logic_error *this_00;
  size_t __size;
  uchar *puVar2;
  void *__src;
  size_type size;
  size_t *len_local;
  uchar **buf_local;
  Pl_Buffer *this_local;
  
  pMVar1 = std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
                     (&this->m);
  if ((pMVar1->ready & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Pl_Buffer::getMallocBuffer() called when not ready");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
            (&this->m);
  __size = std::__cxx11::string::size();
  *len = __size;
  if (__size == 0) {
    *buf = (uchar *)0x0;
  }
  else {
    puVar2 = (uchar *)malloc(__size);
    *buf = puVar2;
    puVar2 = *buf;
    std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
              (&this->m);
    __src = (void *)std::__cxx11::string::data();
    memcpy(puVar2,__src,__size);
  }
  std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
            (&this->m);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void
Pl_Buffer::getMallocBuffer(unsigned char** buf, size_t* len)
{
    if (!m->ready) {
        throw std::logic_error("Pl_Buffer::getMallocBuffer() called when not ready");
    }
    auto size = m->data.size();
    *len = size;
    if (size > 0) {
        *buf = reinterpret_cast<unsigned char*>(malloc(size));
        memcpy(*buf, m->data.data(), size);
    } else {
        *buf = nullptr;
    }
    m->data.clear();
}